

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeInternalForcesContIntPreInt
          (ChElementShellANCF_3833 *this,ChVectorDynamic<> *Fi)

{
  Map<Eigen::Matrix<double,_72,_1,_0,_72,_1>,_0,_Eigen::Stride<0,_0>_> QiReshapedLiu;
  Map<Eigen::Matrix<double,_576,_1,_0,_576,_1>,_0,_Eigen::Stride<0,_0>_> PI1;
  Map<Eigen::Matrix<double,_576,_1,_0,_576,_1>,_0,_Eigen::Stride<0,_0>_> K1_vec;
  MatrixNx3 QiCompactLiu;
  Matrix3xN ebar;
  Matrix3xN ebardot;
  MatrixNxN K1_matrix;
  MatrixNxN PI1_matrix;
  undefined1 local_2b78 [16];
  Rhs local_2b68;
  Matrix3xN *local_2b58;
  DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>_>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>_>
  *local_2b50 [2];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>_>
  local_2b40 [14];
  Matrix3xN local_2900;
  Matrix3xN local_26c0;
  DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>_>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>_>
  local_2480 [16];
  double local_2470;
  non_const_type local_2468;
  Matrix3xN *local_2458;
  PlainObjectBase<Eigen::Matrix<double,24,24,1,24,24>> local_1280 [4688];
  
  local_2b78._8_8_ = local_2b78._0_8_;
  CalcCoordMatrix(this,&local_2900);
  CalcCoordDerivMatrix(this,&local_26c0);
  local_2b68._0_8_ = 0x3fe0000000000000;
  local_2b50[0] =
       (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>_>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>_>
        *)&local_2900;
  Eigen::operator*(local_2b40,(double *)&local_2b68,(StorageBaseType *)local_2b50);
  local_2470 = local_2b40[0].m_lhs.m_functor.m_other;
  local_2468 = local_2b40[0].m_rhs.m_matrix;
  local_2458 = &local_2900;
  Eigen::PlainObjectBase<Eigen::Matrix<double,24,24,1,24,24>>::
  _set_noalias<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,3,0,24,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,24,1,3,24>>const>,Eigen::Matrix<double,3,24,1,3,24>,0>>
            (local_1280,local_2480);
  if (this->m_damping_enabled == true) {
    local_2b68._0_8_ = &local_26c0;
    Eigen::operator*(local_2b40,&this->m_Alpha,(StorageBaseType *)&local_2b68);
    local_2458 = &local_2900;
    local_2470 = local_2b40[0].m_lhs.m_functor.m_other;
    local_2468 = local_2b40[0].m_rhs.m_matrix;
    Eigen::MatrixBase<Eigen::Matrix<double,24,24,1,24,24>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,24,24,1,24,24>> *)local_1280,
               (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>_>,_Eigen::Matrix<double,_3,_24,_1,_3,_24>,_0>_>
                *)local_2480);
  }
  local_2b68._0_8_ = local_1280;
  local_2b50[0] = local_2480;
  Eigen::
  Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Map<Eigen::Matrix<double,_576,_1,_0,_576,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
  ::Product((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Map<Eigen::Matrix<double,_576,_1,_0,_576,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             *)local_2b40,&this->m_O1,&local_2b68);
  local_2b78._0_8_ = (StorageBaseType *)local_2b50;
  Eigen::
  NoAlias<Eigen::Map<Eigen::Matrix<double,576,1,0,576,1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>::
  operator=((NoAlias<Eigen::Map<Eigen::Matrix<double,576,1,0,576,1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
             *)local_2b78,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Map<Eigen::Matrix<double,_576,_1,_0,_576,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
             *)local_2b40);
  Eigen::MatrixBase<Eigen::Matrix<double,24,24,1,24,24>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)local_2b40,(MatrixBase<Eigen::Matrix<double,24,24,1,24,24>> *)local_2480,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->m_K3Compact);
  local_2b78._0_8_ = &this->m_K13Compact;
  Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixBase> *)local_2b78,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_24,_24,_1,_24,_24>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_2b40);
  local_2b58 = &local_2900;
  local_2b78 = (undefined1  [16])
               Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->m_K13Compact,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>_> *)
                          &local_2b58);
  Eigen::PlainObjectBase<Eigen::Matrix<double,24,3,1,24,3>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,3,24,1,3,24>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,24,3,1,24,3>> *)local_2b40,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>,_0>_>
              *)local_2b78);
  local_2b78._0_8_ = local_2b40;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Map<Eigen::Matrix<double,72,1,0,72,1>,0,Eigen::Stride<0,0>>>
            (Fi,(Map<Eigen::Matrix<double,_72,_1,_0,_72,_1>,_0,_Eigen::Stride<0,_0>_> *)local_2b78);
  return;
}

Assistant:

void ChElementShellANCF_3833::ComputeInternalForcesContIntPreInt(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Pre-Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the components of the
    // generalized internal force vector and its Jacobian that need to be integrated across the volume are calculated
    // once prior to the start of the simulation.  This makes this method well suited for applications with many
    // discrete layers since the in-simulation calculations are independent of the number of Gauss quadrature points
    // used throughout the entire element.

    Matrix3xN ebar;
    Matrix3xN ebardot;

    CalcCoordMatrix(ebar);
    CalcCoordDerivMatrix(ebardot);

    // Calculate PI1 which is a combined form of the nodal coordinates.  It is calculated in matrix form and then later
    // reshaped into vector format (through a simple reinterpretation of the data)
    MatrixNxN PI1_matrix = 0.5 * ebar.transpose() * ebar;

    // If damping is enabled adjust PI1 to account for the extra terms.  This is the only modification required to
    // include damping in the generalized internal force calculation
    if (m_damping_enabled) {
        PI1_matrix += m_Alpha * ebardot.transpose() * ebar;
    }

    MatrixNxN K1_matrix;

    // Setup the reshaped/reinterpreted/mapped forms of PI1 and K1 to make the calculation of K1 simpler
    Eigen::Map<ChVectorN<double, NSF * NSF>> PI1(PI1_matrix.data(), PI1_matrix.size());
    Eigen::Map<ChVectorN<double, NSF * NSF>> K1_vec(K1_matrix.data(), K1_matrix.size());

    // Calculate the matrix K1 in mapped vector form and the resulting matrix will be in the correct form to combine
    // with K3
    K1_vec.noalias() = m_O1 * PI1;

    // Store the combined sum of K1 and K3 since it will be used again in the Jacobian calculation
    m_K13Compact.noalias() = K1_matrix - m_K3Compact;

    // Multiply the combined K1 and K3 matrix by the nodal coordinates in compact form and then remap it into the
    // required vector order that is the generalized internal force vector
    MatrixNx3 QiCompactLiu = m_K13Compact * ebar.transpose();
    Eigen::Map<Vector3N> QiReshapedLiu(QiCompactLiu.data(), QiCompactLiu.size());

    Fi = QiReshapedLiu;
}